

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

double FIX::double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  bool bVar1;
  double dVar2;
  DiyFp diy_fp;
  bool local_99;
  undefined1 local_98 [12];
  Double local_88;
  int local_7c;
  bool local_75;
  int middle_value;
  uint uStack_70;
  bool zero_tail;
  int dropped_bits;
  int dropped_bits_mask;
  int overflow_bits_count;
  int overflow;
  int digit;
  int radix;
  int exponent;
  int64_t number;
  undefined4 local_48;
  int kSignificandSize;
  int kSingleSize;
  int kDoubleSize;
  bool *result_is_junk_local;
  double dStack_30;
  bool read_as_double_local;
  double junk_string_value_local;
  bool allow_trailing_junk_local;
  char *pcStack_20;
  bool sign_local;
  char *end_local;
  char **current_local;
  
  _kSingleSize = result_is_junk;
  result_is_junk_local._7_1_ = read_as_double;
  dStack_30 = junk_string_value;
  junk_string_value_local._6_1_ = allow_trailing_junk;
  junk_string_value_local._7_1_ = sign;
  pcStack_20 = end;
  end_local = (char *)current;
  if (*current == end) {
    __assert_fail("*current != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x21d,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  kSignificandSize = 0x35;
  local_48 = 0x18;
  number._4_4_ = 0x18;
  if (read_as_double) {
    number._4_4_ = 0x35;
  }
  *result_is_junk = true;
  while (**current == '0') {
    *current = *current + 1;
    if (*current == end) {
      *result_is_junk = false;
      dVar2 = SignedZero(sign);
      return dVar2;
    }
  }
  _radix = 0;
  digit = 0;
  overflow = 8;
  while( true ) {
    bVar1 = IsDecimalDigitForRadix((int)**(char **)end_local,8);
    if (bVar1) {
      overflow_bits_count = **(char **)end_local + -0x30;
    }
    else {
      bVar1 = IsCharacterDigitForRadix((int)**(char **)end_local,8,'a');
      if (bVar1) {
        overflow_bits_count = **(char **)end_local + -0x57;
      }
      else {
        bVar1 = IsCharacterDigitForRadix((int)**(char **)end_local,8,'A');
        if (!bVar1) {
          if (((junk_string_value_local._6_1_ & 1) == 0) &&
             (bVar1 = AdvanceToNonspace<char*>((char **)end_local,pcStack_20), bVar1)) {
            return dStack_30;
          }
          goto LAB_00227866;
        }
        overflow_bits_count = **(char **)end_local + -0x37;
      }
    }
    _radix = _radix * 8 + (long)overflow_bits_count;
    dropped_bits_mask = (int)((long)_radix >> ((byte)number._4_4_ & 0x3f));
    if (dropped_bits_mask != 0) break;
    *(long *)end_local = *(long *)end_local + 1;
    if (*(char **)end_local == pcStack_20) goto LAB_00227866;
  }
  dropped_bits = 1;
  for (; 1 < dropped_bits_mask; dropped_bits_mask = dropped_bits_mask >> 1) {
    dropped_bits = dropped_bits + 1;
  }
  uStack_70 = (1 << ((byte)dropped_bits & 0x1f)) - 1;
  middle_value = (uint)_radix & uStack_70;
  _radix = (long)_radix >> ((byte)dropped_bits & 0x3f);
  digit = dropped_bits;
  local_75 = true;
  while ((*(long *)end_local = *(long *)end_local + 1, *(char **)end_local != pcStack_20 &&
         (bVar1 = isDigit((int)**(char **)end_local,8), bVar1))) {
    local_99 = false;
    if ((local_75 & 1U) != 0) {
      local_99 = **(char **)end_local == '0';
    }
    local_75 = local_99;
    digit = digit + 3;
  }
  if (((junk_string_value_local._6_1_ & 1) == 0) &&
     (bVar1 = AdvanceToNonspace<char*>((char **)end_local,pcStack_20), bVar1)) {
    return dStack_30;
  }
  local_7c = 1 << ((char)dropped_bits - 1U & 0x1f);
  if (local_7c < middle_value) {
    _radix = _radix + 1;
  }
  else if ((middle_value == local_7c) && (((_radix & 1) != 0 || ((local_75 & 1U) == 0)))) {
    _radix = _radix + 1;
  }
  if ((_radix & 1L << ((byte)number._4_4_ & 0x3f)) != 0) {
    digit = digit + 1;
    _radix = (long)_radix >> 1;
  }
LAB_00227866:
  if (1L << ((byte)number._4_4_ & 0x3f) <= (long)_radix) {
    __assert_fail("number < ((int64_t)1 << kSignificandSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x273,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  if ((long)(double)(long)_radix == _radix) {
    *_kSingleSize = false;
    if (digit == 0) {
      if ((junk_string_value_local._7_1_ & 1) != 0) {
        if (_radix == 0) {
          return -0.0;
        }
        _radix = -_radix;
      }
      current_local = (char **)(double)(long)_radix;
    }
    else {
      if (_radix == 0) {
        __assert_fail("number != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x280,
                      "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                     );
      }
      DiyFp::DiyFp((DiyFp *)local_98,_radix,digit);
      diy_fp._12_4_ = 0;
      diy_fp.f_ = local_98._0_8_;
      diy_fp.e_ = local_98._8_4_;
      Double::Double(&local_88,diy_fp);
      current_local = (char **)Double::value(&local_88);
    }
    return (double)current_local;
  }
  __assert_fail("static_cast<int64_t>(static_cast<double>(number)) == number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                ,0x274,
                "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
               );
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}